

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall pegmatite::ExprPtr::ExprPtr(ExprPtr *this,Rule *r)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  peVar1 = (element_type *)operator_new(0x10);
  peVar1->_vptr_Expr = (_func_int **)&PTR__Expr_00165f60;
  peVar1[1]._vptr_Expr = (_func_int **)r;
  (this->super_shared_ptr<pegmatite::Expr>).
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_shared_ptr<pegmatite::Expr>).
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001662d0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)peVar1;
  (this->super_shared_ptr<pegmatite::Expr>).
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  return;
}

Assistant:

ExprPtr::ExprPtr(const Rule &r) : std::shared_ptr<Expr>(new RuleReferenceExpr(r)) {}